

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getDualViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *maxviol,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *sumviol)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  undefined8 in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  VarStatus rowStatus;
  int r;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *dual;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc98;
  int n;
  undefined4 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca4;
  undefined1 in_stack_fffffffffffffca5;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffca8;
  type_conflict5 local_349;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcc0;
  undefined1 local_308 [40];
  double in_stack_fffffffffffffd20;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd28;
  undefined1 local_2d0 [56];
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 local_280 [56];
  undefined1 local_248 [56];
  undefined1 local_210 [56];
  undefined8 local_1d8;
  VarStatus local_1d0;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 local_1c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  undefined8 local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  bool local_191;
  undefined1 *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined8 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_89;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_1b0 = in_RDX;
  local_1a8 = in_RSI;
  bVar1 = hasBasis(in_RDI);
  if (bVar1) {
    _syncRealSolution((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT17(in_stack_fffffffffffffca7,
                                  CONCAT16(in_stack_fffffffffffffca6,
                                           CONCAT15(in_stack_fffffffffffffca5,
                                                    CONCAT14(in_stack_fffffffffffffca4,
                                                             in_stack_fffffffffffffca0)))));
    local_1b8 = &(in_RDI->_solReal)._dual;
    local_1c0 = 0;
    local_130 = local_1a8;
    local_138 = &local_1c0;
    local_128 = local_138;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    local_1c8 = 0;
    local_148 = local_1b0;
    local_150 = &local_1c8;
    local_140 = local_150;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    local_1cc = numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x479067);
    while (local_1cc = local_1cc + -1, -1 < local_1cc) {
      local_1d0 = basisRowStatus(in_stack_fffffffffffffca8,
                                 CONCAT13(in_stack_fffffffffffffca7,
                                          CONCAT12(in_stack_fffffffffffffca6,
                                                   CONCAT11(in_stack_fffffffffffffca5,
                                                            in_stack_fffffffffffffca4))));
      iVar3 = intParam(in_RDI,OBJSENSE);
      n = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      if (iVar3 == -1) {
        local_349 = false;
        if ((local_1d0 != ON_UPPER) && (local_349 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            CONCAT15(in_stack_fffffffffffffca5,
                                                     CONCAT14(in_stack_fffffffffffffca4,
                                                              in_stack_fffffffffffffca0)))),n);
          local_1d8 = 0;
          local_349 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_fffffffffffffc98,(double *)0x4790fc);
        }
        if (local_349 != false) {
          local_28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffca7,
                                              CONCAT16(in_stack_fffffffffffffca6,
                                                       CONCAT15(in_stack_fffffffffffffca5,
                                                                CONCAT14(in_stack_fffffffffffffca4,
                                                                         in_stack_fffffffffffffca0))
                                                      )),
                                  (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          local_20 = local_210;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = local_210;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))),
                     in_stack_fffffffffffffc98);
          local_8 = local_210;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffcc0,(self_type *)in_RDI);
          in_stack_fffffffffffffca8 =
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT17(in_stack_fffffffffffffca7,
                                           CONCAT16(in_stack_fffffffffffffca6,
                                                    CONCAT15(in_stack_fffffffffffffca5,
                                                             CONCAT14(in_stack_fffffffffffffca4,
                                                                      in_stack_fffffffffffffca0)))),
                               (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          local_50 = local_248;
          local_58 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_59,local_1a8);
          local_40 = local_248;
          local_48 = local_58;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))),
                     in_stack_fffffffffffffc98);
          local_38 = local_248;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc98,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x479267);
          if (tVar2) {
            local_88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT17(in_stack_fffffffffffffca7,
                                                CONCAT16(in_stack_fffffffffffffca6,
                                                         CONCAT15(in_stack_fffffffffffffca5,
                                                                  CONCAT14(in_stack_fffffffffffffca4
                                                                           ,
                                                  in_stack_fffffffffffffca0)))),
                                    (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
            local_80 = local_280;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_89,local_88);
            local_70 = local_280;
            local_78 = local_88;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
            local_68 = local_280;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))));
            local_178 = local_1a8;
            local_180 = local_280;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
          }
        }
        in_stack_fffffffffffffca7 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffca7 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(ulong)CONCAT16(in_stack_fffffffffffffca6,
                                          CONCAT15(in_stack_fffffffffffffca5,
                                                   CONCAT14(in_stack_fffffffffffffca4,
                                                            in_stack_fffffffffffffca0))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          local_288 = 0;
          in_stack_fffffffffffffca7 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc98,(double *)0x47938a);
        }
        if ((type_conflict5)in_stack_fffffffffffffca7 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            CONCAT15(in_stack_fffffffffffffca5,
                                                     CONCAT14(in_stack_fffffffffffffca4,
                                                              in_stack_fffffffffffffca0)))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffcc0,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            CONCAT15(in_stack_fffffffffffffca5,
                                                     CONCAT14(in_stack_fffffffffffffca4,
                                                              in_stack_fffffffffffffca0)))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc98,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x4793e3);
          if (tVar2) {
            local_160 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffca7,
                                                 CONCAT16(in_stack_fffffffffffffca6,
                                                          CONCAT15(in_stack_fffffffffffffca5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffca4,
                                                  in_stack_fffffffffffffca0)))),
                                     (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
            local_158 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
          }
        }
      }
      else {
        in_stack_fffffffffffffca6 = false;
        if ((local_1d0 != ON_UPPER) && (in_stack_fffffffffffffca6 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   (uint7)CONCAT15(in_stack_fffffffffffffca5,
                                                   CONCAT14(in_stack_fffffffffffffca4,
                                                            in_stack_fffffffffffffca0))),n);
          local_290 = 0;
          in_stack_fffffffffffffca6 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc98,(double *)0x479481);
        }
        if ((type_conflict5)in_stack_fffffffffffffca6 != false) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            CONCAT15(in_stack_fffffffffffffca5,
                                                     CONCAT14(in_stack_fffffffffffffca4,
                                                              in_stack_fffffffffffffca0)))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffcc0,(self_type *)in_RDI);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            CONCAT15(in_stack_fffffffffffffca5,
                                                     CONCAT14(in_stack_fffffffffffffca4,
                                                              in_stack_fffffffffffffca0)))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc98,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x4794da);
          if (tVar2) {
            local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffca7,
                                                 CONCAT16(in_stack_fffffffffffffca6,
                                                          CONCAT15(in_stack_fffffffffffffca5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffca4,
                                                  in_stack_fffffffffffffca0)))),
                                     (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
            local_168 = local_1a8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
          }
        }
        in_stack_fffffffffffffca5 = false;
        if ((local_1d0 != ON_LOWER) && (in_stack_fffffffffffffca5 = false, local_1d0 != FIXED)) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,
                                            (uint6)CONCAT14(in_stack_fffffffffffffca4,
                                                            in_stack_fffffffffffffca0))),
                       (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          local_298 = 0;
          in_stack_fffffffffffffca5 =
               boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)in_stack_fffffffffffffc98,(double *)0x479573);
        }
        if ((type_conflict5)in_stack_fffffffffffffca5 != false) {
          local_b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT17(in_stack_fffffffffffffca7,
                                              CONCAT16(in_stack_fffffffffffffca6,
                                                       CONCAT15(in_stack_fffffffffffffca5,
                                                                CONCAT14(in_stack_fffffffffffffca4,
                                                                         in_stack_fffffffffffffca0))
                                                      )),
                                  (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
          local_b0 = local_2d0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b9,local_b8);
          local_a0 = local_2d0;
          local_a8 = local_b8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))),
                     in_stack_fffffffffffffc98);
          iVar3 = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
          local_98 = local_2d0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))));
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_fffffffffffffcc0,(self_type *)in_RDI);
          in_stack_fffffffffffffc98 =
               &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT17(in_stack_fffffffffffffca7,
                                         CONCAT16(in_stack_fffffffffffffca6,
                                                  CONCAT15(in_stack_fffffffffffffca5,
                                                           CONCAT14(in_stack_fffffffffffffca4,
                                                                    in_stack_fffffffffffffca0)))),
                             iVar3)->m_backend;
          local_e0 = local_308;
          local_e8 = local_1a8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_e9,local_1a8);
          local_d0 = local_308;
          local_d8 = local_e8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))),
                     in_stack_fffffffffffffc98);
          local_c8 = local_308;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffca7,
                              CONCAT16(in_stack_fffffffffffffca6,
                                       CONCAT15(in_stack_fffffffffffffca5,
                                                CONCAT14(in_stack_fffffffffffffca4,
                                                         in_stack_fffffffffffffca0)))));
          tVar2 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffc98,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x4796d0);
          if (tVar2) {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT17(in_stack_fffffffffffffca7,
                                                 CONCAT16(in_stack_fffffffffffffca6,
                                                          CONCAT15(in_stack_fffffffffffffca5,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffca4,
                                                  in_stack_fffffffffffffca0)))),
                                     (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
            local_110 = &stack0xfffffffffffffcc0;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_119,local_118);
            local_100 = &stack0xfffffffffffffcc0;
            local_108 = local_118;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
            local_f8 = &stack0xfffffffffffffcc0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))));
            local_188 = local_1a8;
            local_190 = &stack0xfffffffffffffcc0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,
                                         CONCAT15(in_stack_fffffffffffffca5,
                                                  CONCAT14(in_stack_fffffffffffffca4,
                                                           in_stack_fffffffffffffca0)))),
                       in_stack_fffffffffffffc98);
          }
        }
      }
    }
    local_191 = true;
  }
  else {
    local_191 = false;
  }
  return local_191;
}

Assistant:

bool SoPlexBase<R>::getDualViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& dual = _solReal._dual;
   assert(dual.dim() == numRows());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int r = numRows() - 1; r >= 0; r--)
   {
      typename SPxSolverBase<R>::VarStatus rowStatus = basisRowStatus(r);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }
      }
      else
      {
         if(rowStatus != SPxSolverBase<R>::ON_UPPER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] > 0.0)
         {
            sumviol += dual[r];

            if(dual[r] > maxviol)
               maxviol = dual[r];
         }

         if(rowStatus != SPxSolverBase<R>::ON_LOWER && rowStatus != SPxSolverBase<R>::FIXED && dual[r] < 0.0)
         {
            sumviol += -dual[r];

            if(dual[r] < -maxviol)
               maxviol = -dual[r];
         }
      }
   }

   return true;
}